

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O1

Name __thiscall
wasm::Names::getValidName
          (Names *this,Name root,function<bool_(wasm::Name)> *check,Index hint,string *separator)

{
  char cVar1;
  char cVar2;
  long *plVar3;
  undefined8 uVar4;
  uint uVar5;
  size_type *psVar6;
  char *pcVar7;
  ulong uVar8;
  uint __val;
  ulong uVar9;
  undefined4 in_register_00000084;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Name NVar12;
  char *local_a0;
  Names *local_98;
  size_type *local_90;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefixed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  
  auVar11._8_8_ = local_a0;
  auVar11._0_8_ = local_98;
  pcVar7 = root.super_IString.str._M_str;
  local_a0 = root.super_IString.str._M_len;
  __str.field_2._8_8_ = this;
  prefixed._M_dataplus._M_p = local_a0;
  if (*(long *)(pcVar7 + 0x10) == 0) {
LAB_0014eb6c:
    uVar4 = std::__throw_bad_function_call();
    if ((size_type *)prefixed.field_2._8_8_ != &name._M_string_length) {
      operator_delete((void *)prefixed.field_2._8_8_,name._M_string_length + 1);
    }
    _Unwind_Resume(uVar4);
  }
  uVar9 = (ulong)check & 0xffffffff;
  cVar2 = (**(code **)(pcVar7 + 0x18))(pcVar7,(undefined1 *)((long)&__str.field_2 + 8));
  local_98 = this;
  if (cVar2 == '\0') {
    prefixed.field_2._8_8_ = &name._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&prefixed.field_2 + 8),local_a0,this + (long)local_a0);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               (prefixed.field_2._M_local_buf + 8,
                                *(ulong *)CONCAT44(in_register_00000084,hint));
    __str.field_2._8_8_ = &prefixed._M_string_length;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      prefixed._M_string_length = *psVar6;
      prefixed.field_2._M_allocated_capacity = plVar3[3];
    }
    else {
      prefixed._M_string_length = *psVar6;
      __str.field_2._8_8_ = (size_type *)*plVar3;
    }
    prefixed._M_dataplus._M_p = (pointer)plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((size_type *)prefixed.field_2._8_8_ != &name._M_string_length) {
      operator_delete((void *)prefixed.field_2._8_8_,name._M_string_length + 1);
    }
    do {
      cVar2 = '\x01';
      __val = (uint)uVar9;
      if (9 < __val) {
        uVar8 = uVar9;
        cVar1 = '\x04';
        do {
          cVar2 = cVar1;
          uVar5 = (uint)uVar8;
          if (uVar5 < 100) {
            cVar2 = cVar2 + -2;
            goto LAB_0014ea1c;
          }
          if (uVar5 < 1000) {
            cVar2 = cVar2 + -1;
            goto LAB_0014ea1c;
          }
          if (uVar5 < 10000) goto LAB_0014ea1c;
          uVar8 = uVar8 / 10000;
          cVar1 = cVar2 + '\x04';
        } while (99999 < uVar5);
        cVar2 = cVar2 + '\x01';
      }
LAB_0014ea1c:
      local_90 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_90,cVar2);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_90,(uint)__str._M_dataplus._M_p,__val);
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_90,0,(char *)0x0,__str.field_2._8_8_);
      prefixed.field_2._8_8_ = &name._M_string_length;
      psVar6 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar6) {
        name._M_string_length = *psVar6;
        name.field_2._M_allocated_capacity = plVar3[3];
      }
      else {
        name._M_string_length = *psVar6;
        prefixed.field_2._8_8_ = (size_type *)*plVar3;
      }
      name._M_dataplus._M_p = (pointer)plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_90 != &__str._M_string_length) {
        operator_delete(local_90,__str._M_string_length + 1);
      }
      auVar10 = wasm::IString::interned(name._M_dataplus._M_p,prefixed.field_2._8_8_,0);
      __str._M_dataplus._M_p = auVar10._8_8_;
      local_90 = auVar10._0_8_;
      if (*(long *)(pcVar7 + 0x10) == 0) {
        std::__throw_bad_function_call();
        goto LAB_0014eb6c;
      }
      cVar2 = (**(code **)(pcVar7 + 0x18))(pcVar7,&local_90);
      if (cVar2 == '\0') {
        uVar9 = (ulong)(__val + 1);
      }
      else {
        auVar11 = wasm::IString::interned(name._M_dataplus._M_p,prefixed.field_2._8_8_,0);
      }
      local_a0 = auVar11._8_8_;
      local_98 = auVar11._0_8_;
      if ((size_type *)prefixed.field_2._8_8_ != &name._M_string_length) {
        operator_delete((void *)prefixed.field_2._8_8_,name._M_string_length + 1);
      }
    } while (cVar2 == '\0');
    if ((size_type *)__str.field_2._8_8_ != &prefixed._M_string_length) {
      operator_delete((void *)__str.field_2._8_8_,prefixed._M_string_length + 1);
    }
  }
  NVar12.super_IString.str._M_str = local_a0;
  NVar12.super_IString.str._M_len = (size_t)local_98;
  return (Name)NVar12.super_IString.str;
}

Assistant:

inline Name getValidName(Name root,
                         std::function<bool(Name)> check,
                         Index hint = 0,
                         std::string separator = "_") {
  if (check(root)) {
    return root;
  }
  auto prefixed = std::string(root.str) + separator;
  Index num = hint;
  while (1) {
    auto name = prefixed + std::to_string(num);
    if (check(name)) {
      return name;
    }
    num++;
  }
}